

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# call.hpp
# Opt level: O3

bool __thiscall
boost::spirit::qi::
alternative<boost::fusion::cons<boost::spirit::qi::lazy_parser<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::eps>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::less_equal,boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::reference_wrapper<unsigned_int>>,0l>>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<int>,0l>>>,2l>>>,2l>>,boost::spirit::unused_type>,boost::fusion::cons<boost::spirit::qi::sequence<boost::fusion::cons<boost::spirit::qi::lazy_parser<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::eps>,boost::phoenix::actor<boos...al,boost::proto::argsns_::term<int>,0l>>>,2l>>>,2l>>>,boost::fusion::nil_>>>,boost::fusion::nil_>>>>
::
parse<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,boost::spirit::unused_type_const,boost::spirit::unused_type,boost::spirit::unused_type_const>
          (alternative<boost::fusion::cons<boost::spirit::qi::lazy_parser<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::eps>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::less_equal,boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::reference_wrapper<unsigned_int>>,0l>>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<int>,0l>>>,2l>>>,2l>>,boost::spirit::unused_type>,boost::fusion::cons<boost::spirit::qi::sequence<boost::fusion::cons<boost::spirit::qi::lazy_parser<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::eps>,boost::phoenix::actor<boos___al,boost::proto::argsns_::term<int>,0l>>>,2l>>>,2l>>>,boost::fusion::nil_>>>_boost__fusion__nil_>>>>
           *this,__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *first,
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          *last,unused_type *context,unused_type *skipper,unused_type *attr_)

{
  byte *pbVar1;
  bool bVar2;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> it
  ;
  type x;
  
  if (*(uint *)(this + 0x10) < **(uint **)(this + 8)) {
    if ((**(int **)(this + 0x28) != *(int *)(this + 0x30)) ||
       (pbVar1 = first->_M_current, last->_M_current == pbVar1)) {
      bVar2 = sequence_base<boost::spirit::qi::sequence<boost::fusion::cons<boost::spirit::qi::lazy_parser<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::eps>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::equal_to,boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::reference_wrapper<unsigned_int>>,0l>>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<int>,0l>>>,2l>>>,2l>>,boost::spirit::unused_type>,boost::fusion::cons<boost::spirit::qi::action<boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::integer<16>,(boost::spirit::endian::endianness)0,16>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,boost::proto::ar...oto::tagns_::tag::terminal,boost::proto::argsns_::term<int>,0l>>>,2l>>>,2l>>>,boost::fusion::nil_>>>
              ::
              parse_impl<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,boost::spirit::unused_type_const,boost::spirit::unused_type,boost::spirit::unused_type_const>
                        ((sequence_base<boost::spirit::qi::sequence<boost::fusion::cons<boost::spirit::qi::lazy_parser<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::eps>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::equal_to,boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::reference_wrapper<unsigned_int>>,0l>>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<int>,0l>>>,2l>>>,2l>>,boost::spirit::unused_type>,boost::fusion::cons<boost::spirit::qi::action<boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::integer<16>,(boost::spirit::endian::endianness)0,16>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,boost::proto::ar___oto::tagns_::tag::terminal,boost::proto::argsns_::term<int>,0l>>>,2l>>>,2l>>>_boost__fusion__nil_>>>
                          *)(this + 0x60));
      return bVar2;
    }
    **(int **)(this + 0x48) = **(int **)(this + 0x48) + (uint)*pbVar1;
    first->_M_current = pbVar1 + 1;
  }
  return true;
}

Assistant:

BOOST_FORCEINLINE
            result_type operator ()(
                typename impl2::expr_param   e
              , typename impl2::state_param  s
              , typename impl2::data_param   d
            ) const
            {
                return typename detail::poly_function_traits<Fun, Fun(a0, a1)>::function_type()(
                    detail::as_lvalue(typename when<_, A0>::template impl<Expr, State, Data>()(e, s, d))
                  , detail::as_lvalue(typename when<_, A1>::template impl<Expr, State, Data>()(e, s, d))
                );
            }